

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

uint Validator::constraintS5(Solution *solution)

{
  pointer pcVar1;
  uint uVar2;
  bool bVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar4;
  Scenario *this;
  Nurse *this_00;
  string *psVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  uint uVar8;
  string local_90;
  Contract local_70;
  
  pmVar4 = Solution::getNurses_abi_cxx11_(solution);
  p_Var6 = (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
  uVar8 = 0;
  if ((_Rb_tree_header *)p_Var6 != p_Var7) {
    do {
      this = Scenario::getInstance();
      this_00 = NurseSolution::getNurse(*(NurseSolution **)(p_Var6 + 2));
      psVar5 = Nurse::getContract_abi_cxx11_(this_00);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + psVar5->_M_string_length);
      Scenario::getContract(&local_70,this,&local_90);
      bVar3 = Contract::getCompleteWeekends(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.id._M_dataplus._M_p != &local_70.id.field_2) {
        operator_delete(local_70.id._M_dataplus._M_p,local_70.id.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      uVar2 = uVar8;
      if (bVar3) {
        bVar3 = nurseWorkingHalfWeekEnd(*(NurseSolution **)(p_Var6 + 2));
        uVar2 = uVar8 + 0x1e;
        if (!bVar3) {
          uVar2 = uVar8;
        }
      }
      uVar8 = uVar2;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var7);
  }
  return uVar8;
}

Assistant:

unsigned int Validator::constraintS5(const Solution &solution) {

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
        if(Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getCompleteWeekends())
            {
                if(nurseWorkingHalfWeekEnd(nurse.second))
                    sum += 30;
            }
    return sum;
}